

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_valued_fast_fourier_transform.h
# Opt level: O0

void __thiscall sptk::RealValuedFastFourierTransform::Buffer::~Buffer(Buffer *this)

{
  Buffer *in_RDI;
  
  ~Buffer(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~Buffer() {
    }